

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::FindSourceObjectIfPossible
          (CopyPropagateArrays *this,Instruction *var_inst,Instruction *store_inst)

{
  bool bVar1;
  Instruction *in_RCX;
  uint uVar2;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source;
  MemoryObject *local_20;
  
  if (store_inst->opcode_ != OpVariable) {
    __assert_fail("var_inst->opcode() == spv::Op::OpVariable && \"Expecting a variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x76,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::FindSourceObjectIfPossible(Instruction *, Instruction *)"
                 );
  }
  if ((in_RCX != (Instruction *)0x0) &&
     (bVar1 = HasValidReferencesOnly((CopyPropagateArrays *)var_inst,store_inst,in_RCX), bVar1)) {
    uVar2 = (in_RCX->has_result_id_ & 1) + 1;
    if (in_RCX->has_type_id_ == false) {
      uVar2 = (uint)in_RCX->has_result_id_;
    }
    Instruction::GetSingleWordOperand(in_RCX,uVar2 + 1);
    GetSourceObjectIfAny((CopyPropagateArrays *)&stack0xffffffffffffffe0,(uint32_t)var_inst);
    if ((local_20 == (MemoryObject *)0x0) ||
       (bVar1 = HasNoStores((CopyPropagateArrays *)var_inst,local_20->variable_inst_), !bVar1)) {
      (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
    }
    else {
      (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)local_20;
      local_20 = (MemoryObject *)0x0;
    }
    if (local_20 == (MemoryObject *)0x0) {
      return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
                )this;
    }
    std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
              ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)
               &stack0xffffffffffffffe0,local_20);
    return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )this;
  }
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::FindSourceObjectIfPossible(Instruction* var_inst,
                                                Instruction* store_inst) {
  assert(var_inst->opcode() == spv::Op::OpVariable && "Expecting a variable.");

  // Check that the variable is a composite object where |store_inst|
  // dominates all of its loads.
  if (!store_inst) {
    return nullptr;
  }

  // Look at the loads to ensure they are dominated by the store.
  if (!HasValidReferencesOnly(var_inst, store_inst)) {
    return nullptr;
  }

  // If so, look at the store to see if it is the copy of an object.
  std::unique_ptr<MemoryObject> source = GetSourceObjectIfAny(
      store_inst->GetSingleWordInOperand(kStoreObjectInOperand));

  if (!source) {
    return nullptr;
  }

  // Ensure that |source| does not change between the point at which it is
  // loaded, and the position in which |var_inst| is loaded.
  //
  // For now we will go with the easy to implement approach, and check that the
  // entire variable (not just the specific component) is never written to.

  if (!HasNoStores(source->GetVariable())) {
    return nullptr;
  }
  return source;
}